

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O1

uint32_t virtio_rx_batch(ixy_device *ixy,uint16_t queue_id,pkt_buf **bufs,uint32_t num_bufs)

{
  uint32_t uVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  ulong in_RAX;
  undefined8 *puVar7;
  pkt_buf *ppVar8;
  ssize_t sVar9;
  undefined8 extraout_RAX;
  mempool *pmVar10;
  ulong uVar11;
  char *__addr;
  __off_t _Var12;
  undefined8 extraout_RAX_00;
  long *plVar13;
  uintptr_t uVar14;
  undefined8 extraout_RAX_01;
  ushort uVar15;
  uint extraout_EDX;
  ulong extraout_RDX;
  ulong uVar16;
  void *unaff_RBP;
  void *pvVar17;
  char cVar18;
  short *__buf;
  uint *puVar19;
  undefined4 *__buf_00;
  ushort *__buf_01;
  long *__buf_02;
  uint uVar20;
  long lVar21;
  long *plVar22;
  long lVar23;
  uint *size;
  uint uVar24;
  undefined *unaff_R13;
  short sVar25;
  int iVar26;
  ulong uVar27;
  char *__s;
  ulong uVar28;
  ulong unaff_R15;
  dma_memory dVar29;
  undefined8 uVar30;
  long *plVar31;
  long alStack_1510 [66];
  ulong uStack_1300;
  char *pcStack_12f8;
  ulong uStack_12f0;
  code *pcStack_12e8;
  long alStack_12e0 [64];
  char acStack_10e0 [4096];
  ulong uStack_e0;
  char *pcStack_d8;
  code *pcStack_d0;
  void *pvStack_c8;
  ulong uStack_c0;
  ushort uStack_b2;
  uint uStack_b0;
  short sStack_aa;
  void *pvStack_a8;
  uintptr_t uStack_a0;
  undefined4 uStack_94;
  ulong uStack_90;
  uint *puStack_88;
  undefined *puStack_80;
  mempool *pmStack_78;
  code *pcStack_68;
  undefined8 uStack_60;
  ixy_device *piStack_58;
  uint *puStack_50;
  ulong uStack_48;
  code *pcStack_40;
  undefined8 uStack_38;
  
  puVar19 = (uint *)ixy[1].driver_name;
  uStack_38 = in_RAX;
  if (num_bufs == 0) {
    uVar27 = 0;
  }
  else {
    uVar27 = 0;
    do {
      uVar15 = (ushort)puVar19[10];
      lVar2 = *(long *)(puVar19 + 6);
      if (uVar15 == *(ushort *)(lVar2 + 2)) goto LAB_00104fce;
      uVar28 = (ulong)uVar15 % (ulong)*puVar19;
      lVar23 = (ulong)*(uint *)(lVar2 + 4 + uVar28 * 8) * 0x10;
      *(ushort *)(puVar19 + 10) = uVar15 + 1;
      uVar15 = *(ushort *)(*(long *)(puVar19 + 2) + 0xc + lVar23);
      pmVar10 = (mempool *)(ulong)uVar15;
      if (uVar15 != 2) {
        pcStack_40 = (code *)0x1050ba;
        virtio_rx_batch_cold_1();
        goto LAB_001050ba;
      }
      puVar7 = (undefined8 *)(*(long *)(puVar19 + 2) + lVar23);
      *puVar7 = 0;
      puVar7[1] = 0;
      uVar24 = *(uint *)(lVar2 + 8 + uVar28 * 8);
      ppVar8 = *(pkt_buf **)(puVar19 + (ulong)*(uint *)(lVar2 + 4 + uVar28 * 8) * 2 + 0xe);
      ppVar8->size = uVar24;
      bufs[uVar27] = ppVar8;
      ixy[1].set_promisc = ixy[1].set_promisc + uVar24;
      ixy[1].tx_batch = ixy[1].tx_batch + 1;
      uVar27 = uVar27 + 1;
    } while (num_bufs != uVar27);
    uVar27 = (ulong)num_bufs;
  }
LAB_00104fce:
  if (*puVar19 != 0) {
    unaff_RBP = (void *)0x0;
    unaff_R13 = (undefined *)0x0;
    do {
      unaff_R15 = (ulong)unaff_R13 & 0xffff;
      num_bufs = (int)unaff_R15 << 4;
      if (*(long *)(*(long *)(puVar19 + 2) + (ulong)num_bufs) == 0) {
        pmVar10 = *(mempool **)(puVar19 + 0xc);
        pcStack_40 = (code *)0x105002;
        ppVar8 = pkt_buf_alloc(pmVar10);
        if (ppVar8 == (pkt_buf *)0x0) goto LAB_001050ba;
        uVar1 = *(uint32_t *)(*(long *)(puVar19 + 0xc) + 8);
        ppVar8->size = uVar1;
        ppVar8->head_room[0x25] = '\0';
        ppVar8->head_room[0x26] = '\0';
        ppVar8->head_room[0x1d] = '\0';
        ppVar8->head_room[0x1e] = '\0';
        ppVar8->head_room[0x1f] = '*';
        ppVar8->head_room[0x20] = '\0';
        ppVar8->head_room[0x21] = '\0';
        ppVar8->head_room[0x22] = '\0';
        ppVar8->head_room[0x23] = '\0';
        ppVar8->head_room[0x24] = '\0';
        lVar2 = *(long *)(puVar19 + 2);
        uVar28 = (ulong)(uint)((int)unaff_R15 << 4);
        *(uint32_t *)(lVar2 + 8 + uVar28) = uVar1 + 10;
        *(uintptr_t *)(lVar2 + uVar28) = ppVar8->buf_addr_phy + 0x36;
        *(undefined4 *)(lVar2 + 0xc + uVar28) = 2;
        *(pkt_buf **)(puVar19 + unaff_R15 * 2 + 0xe) = ppVar8;
        *(short *)(*(long *)(puVar19 + 4) + 4 +
                  ((ulong)*(ushort *)(*(long *)(puVar19 + 4) + 2) % (ulong)*puVar19) * 2) =
             (short)unaff_R13;
        *(short *)(*(long *)(puVar19 + 4) + 2) = *(short *)(*(long *)(puVar19 + 4) + 2) + 1;
        pmVar10 = (mempool *)(ulong)*(uint *)&ixy[1].pci_addr;
        uStack_38 = uStack_38 & 0xffffffffffff;
        num_bufs = 0x10;
        pcStack_40 = (code *)0x10508c;
        sVar9 = pwrite(*(uint *)&ixy[1].pci_addr,(void *)((long)&uStack_38 + 6),2,0x10);
        if (sVar9 != 2) goto LAB_001050bf;
      }
      uVar24 = (int)unaff_R13 + 1;
      unaff_R13 = (undefined *)(ulong)uVar24;
    } while ((uVar24 & 0xffff) < *puVar19);
  }
  return (uint32_t)uVar27;
LAB_001050ba:
  pcStack_40 = (code *)0x1050bf;
  virtio_rx_batch_cold_3();
LAB_001050bf:
  pcStack_40 = virtio_tx_batch;
  virtio_rx_batch_cold_2();
  size = *(uint **)&pmVar10[3].buf_size;
  uVar28 = (ulong)num_bufs;
  uStack_60 = extraout_RAX;
  piStack_58 = ixy;
  puStack_50 = puVar19;
  uStack_48 = uVar27;
  pcStack_40 = (code *)unaff_R15;
  while( true ) {
    if ((ushort)size[10] == *(ushort *)(*(long *)(size + 6) + 2)) break;
    lVar2 = *(long *)(size + 2);
    uVar27 = (ulong)*(uint *)(*(long *)(size + 6) + 4 + ((ulong)(ushort)size[10] % (ulong)*size) * 8
                             );
    lVar23 = uVar27 * 0x10;
    *(undefined8 *)(lVar2 + lVar23) = 0;
    *(undefined4 *)(lVar2 + 8 + lVar23) = 0;
    pcStack_68 = (code *)0x10511f;
    pkt_buf_free(*(pkt_buf **)(size + uVar27 * 2 + 0xe));
    *(short *)(size + 10) = (short)size[10] + 1;
  }
  if (num_bufs == 0) {
    uVar28 = 0;
  }
  else {
    uVar27 = 0;
    uVar15 = 0;
    do {
      uVar24 = *size;
      uVar20 = (uint)uVar15;
      if (uVar20 < uVar24) {
        lVar2 = *(long *)(*(long *)(size + 2) + (ulong)uVar15 * 0x10);
        while (lVar2 != 0) {
          uVar15 = uVar15 + 1;
          uVar20 = (uint)uVar15;
          if (uVar24 <= uVar20) break;
          lVar2 = *(long *)(*(long *)(size + 2) + (ulong)uVar15 * 0x10);
        }
      }
      if (uVar24 == uVar20) {
        uVar28 = uVar27 & 0xffffffff;
        break;
      }
      plVar13 = *(long **)(extraout_RDX + uVar27 * 8);
      uVar24 = *(uint *)((long)plVar13 + 0x14);
      pmVar10[5].base_addr = (void *)((long)pmVar10[5].base_addr + (ulong)uVar24);
      *(long *)&pmVar10[4].buf_size = *(long *)&pmVar10[4].buf_size + 1;
      *(long **)(size + (ulong)uVar15 * 2 + 0xe) = plVar13;
      *(undefined2 *)((long)plVar13 + 0x3e) = 0;
      *(undefined8 *)((long)plVar13 + 0x36) = 0x2a0000;
      lVar2 = *(long *)(size + 2);
      lVar23 = (ulong)uVar15 * 0x10;
      *(uint *)(lVar2 + 8 + lVar23) = uVar24 + 10;
      *(long *)(lVar2 + lVar23) = *plVar13 + 0x36;
      *(undefined4 *)(lVar2 + 0xc + lVar23) = 0;
      *(ushort *)(*(long *)(size + 4) + 4 + (ulong)uVar15 * 2) = uVar15;
      uVar27 = uVar27 + 1;
    } while (uVar27 != uVar28);
  }
  *(short *)(*(long *)(size + 4) + 2) = *(short *)(*(long *)(size + 4) + 2) + (short)uVar28;
  uVar27 = (ulong)pmVar10[2].free_stack_top;
  pvVar17 = (void *)((long)&uStack_60 + 6);
  uStack_60 = CONCAT26(1,(undefined6)uStack_60);
  pcStack_68 = (code *)0x105217;
  sVar9 = pwrite(pmVar10[2].free_stack_top,pvVar17,2,0x10);
  if (sVar9 == 2) {
    return (uint32_t)uVar28;
  }
  pcStack_68 = virtio_legacy_setup_tx_queue;
  virtio_tx_batch_cold_1();
  __s = (char *)((ulong)pvVar17 & 0xffffffff);
  uStack_90 = uVar28;
  puStack_88 = size;
  puStack_80 = unaff_R13;
  pmStack_78 = pmVar10;
  pcStack_68 = (code *)unaff_RBP;
  if ((ushort)((short)pvVar17 - 3U) < 0xfffe) {
    pcStack_d0 = (code *)0x1054ec;
    virtio_legacy_setup_tx_queue_cold_5();
    cVar18 = (char)pvVar17;
    uVar11 = uVar27;
LAB_001054ec:
    pcStack_d0 = (code *)0x1054f1;
    virtio_legacy_setup_tx_queue_cold_1();
LAB_001054f1:
    pcStack_d0 = (code *)0x1054f6;
    virtio_legacy_setup_tx_queue_cold_2();
    uVar16 = extraout_RDX;
LAB_001054f6:
    pcStack_d0 = (code *)0x1054fb;
    virtio_legacy_setup_tx_queue_cold_3();
  }
  else {
    uVar11 = (ulong)*(uint *)(uVar27 + 0x40);
    __buf = &sStack_aa;
    sVar25 = (short)__s;
    pcStack_d0 = (code *)0x10526d;
    sStack_aa = sVar25;
    sVar9 = pwrite(*(uint *)(uVar27 + 0x40),__buf,2,0xe);
    cVar18 = (char)__buf;
    uVar28 = uVar27;
    if (sVar9 != 2) goto LAB_001054ec;
    uVar11 = (ulong)*(uint *)(uVar27 + 0x40);
    puVar19 = &uStack_b0;
    pcStack_d0 = (code *)0x10528e;
    sVar9 = pread(*(uint *)(uVar27 + 0x40),puVar19,4,0xc);
    cVar18 = (char)puVar19;
    if (sVar9 != 4) goto LAB_001054f1;
    uVar16 = (ulong)uStack_b0;
    unaff_R13 = &stderr;
    pvStack_c8 = (void *)CONCAT44(pvStack_c8._4_4_,uStack_b0);
    pcStack_d0 = (code *)0x1052d1;
    uVar24 = fprintf(_stderr,"[DEBUG] %s:%d %s(): Max queue size of tx queue #%u: %u\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/virtio.c"
                     ,0x36,"virtio_legacy_setup_tx_queue",(ulong)pvVar17 & 0xffff);
    uVar11 = (ulong)uVar24;
    if (uVar16 == 0) {
LAB_001052d6:
      return (uint32_t)uVar11;
    }
    size = (uint *)((uVar16 * 0x12 + 0x1003 & 0xfffffffffffff000) + uVar16 * 8 + 4);
    pcStack_d0 = (code *)0x10530c;
    dVar29 = memory_allocate_dma((size_t)size,true);
    uStack_a0 = dVar29.phy;
    unaff_RBP = dVar29.virt;
    pcStack_d0 = (code *)0x105324;
    memset(unaff_RBP,0xab,(size_t)size);
    pcStack_d0 = (code *)0x105355;
    pvStack_c8 = unaff_RBP;
    pvStack_a8 = unaff_RBP;
    fprintf(_stderr,"[DEBUG] %s:%d %s(): Allocated %zu bytes for virt queue at %p\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/virtio.c"
            ,0x3d,"virtio_legacy_setup_tx_queue");
    uVar11 = (ulong)*(uint *)(uVar27 + 0x40);
    __buf_00 = &uStack_94;
    uStack_94 = (undefined4)(uStack_a0 >> 0xc);
    pcStack_d0 = (code *)0x105377;
    sVar9 = pwrite(*(uint *)(uVar27 + 0x40),__buf_00,4,8);
    cVar18 = (char)__buf_00;
    if (sVar9 != 4) goto LAB_001054f6;
    pcStack_d0 = (code *)0x105397;
    size = (uint *)calloc(1,uVar16 * 8 + 0x38);
    *size = uStack_b0;
    *(void **)(size + 2) = pvStack_a8;
    pvStack_c8 = (void *)(uVar16 * 0x10 + (long)pvStack_a8);
    *(void **)(size + 4) = pvStack_c8;
    uStack_c0 = (long)pvStack_c8 + uVar16 * 2 + 0x1003 & 0xfffffffffffff000;
    *(ulong *)(size + 6) = uStack_c0;
    pcStack_d0 = (code *)0x1053fa;
    fprintf(_stderr,"[DEBUG] %s:%d %s(): vring desc: %p, vring avail: %p, vring used: %p\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/virtio.c"
            ,0x43,"virtio_legacy_setup_tx_queue");
    uVar24 = *size;
    if ((ulong)uVar24 != 0) {
      lVar2 = *(long *)(size + 2);
      lVar23 = *(long *)(size + 4);
      lVar3 = *(long *)(size + 6);
      lVar21 = 0;
      do {
        puVar7 = (undefined8 *)(lVar2 + lVar21 * 8);
        *puVar7 = 0;
        puVar7[1] = 0;
        *(undefined2 *)(lVar23 + 4 + lVar21) = 0;
        *(undefined8 *)(lVar3 + 4 + lVar21 * 4) = 0;
        lVar21 = lVar21 + 2;
      } while ((ulong)uVar24 * 2 != lVar21);
    }
    *(undefined2 *)(*(long *)(size + 6) + 2) = 0;
    *(undefined2 *)(*(long *)(size + 4) + 2) = 0;
    *(undefined2 *)(size + 10) = 0;
    uVar11 = (ulong)*(uint *)(uVar27 + 0x40);
    __buf_01 = &uStack_b2;
    pcStack_d0 = (code *)0x10546a;
    sVar9 = pread(*(uint *)(uVar27 + 0x40),__buf_01,2,0x10);
    cVar18 = (char)__buf_01;
    if (sVar9 == 2) {
      pcStack_d0 = (code *)0x1054a1;
      fprintf(_stderr,"[DEBUG] %s:%d %s(): vq notifcation offset %u\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/virtio.c"
              ,0x53,"virtio_legacy_setup_tx_queue",(ulong)uStack_b2);
      *(ulong *)(size + 8) = (ulong)uStack_b2;
      if (sVar25 == 2) {
        pcStack_d0 = (code *)0x1054ba;
        pmVar10 = memory_allocate_mempool(uStack_b0,0x800);
        *(mempool **)(size + 0xc) = pmVar10;
      }
      **(undefined2 **)(size + 4) = 1;
      **(undefined2 **)(size + 6) = 0;
      uVar11 = (ulong)(sVar25 != 1);
      *(uint **)(uVar27 + 0x50 + uVar11 * 8) = size;
      goto LAB_001052d6;
    }
  }
  pcStack_d0 = memory_allocate_dma;
  virtio_legacy_setup_tx_queue_cold_4();
  uVar1 = huge_pg_id;
  plVar13 = alStack_12e0;
  uVar27 = uVar11 + 0x1fffff & 0xffffffffffe00000;
  uStack_e0 = uVar28;
  pcStack_d8 = __s;
  pcStack_d0 = (code *)unaff_RBP;
  if (uVar27 < 0x200001 || cVar18 != '\x01') {
    LOCK();
    pvVar17 = (void *)(ulong)huge_pg_id;
    UNLOCK();
    pcStack_12e8 = (code *)0x105545;
    huge_pg_id = huge_pg_id + 1;
    uVar24 = getpid();
    __s = acStack_10e0;
    pcStack_12e8 = (code *)0x105568;
    snprintf(__s,0x1000,"/mnt/huge/ixy-%d-%d",(ulong)uVar24,(ulong)uVar1);
    pcStack_12e8 = (code *)0x10557c;
    uVar24 = open(__s,0x42,0x1c0);
    unaff_RBP = pvVar17;
    if (uVar24 == 0xffffffff) goto LAB_001055f8;
    unaff_RBP = (void *)(ulong)uVar24;
    pcStack_12e8 = (code *)0x10558d;
    iVar6 = ftruncate(uVar24,uVar27);
    if (iVar6 == -1) goto LAB_00105600;
    pcStack_12e8 = (code *)0x1055ac;
    __addr = (char *)mmap((void *)0x0,uVar27,3,0x40001,uVar24,0);
    if (__addr == (char *)0xffffffffffffffff) goto LAB_00105608;
    pcStack_12e8 = (code *)0x1055c0;
    iVar6 = mlock(__addr,uVar27);
    if (iVar6 != -1) {
      pcStack_12e8 = (code *)0x1055cc;
      close(uVar24);
      pcStack_12e8 = (code *)0x1055d9;
      unlink(acStack_10e0);
      pcStack_12e8 = (code *)0x1055e1;
      virt_to_phys(__addr);
      return (uint32_t)__addr;
    }
  }
  else {
    pcStack_12e8 = (code *)0x1055f8;
    memory_allocate_dma_cold_5();
LAB_001055f8:
    pcStack_12e8 = (code *)0x105600;
    memory_allocate_dma_cold_4();
LAB_00105600:
    pcStack_12e8 = (code *)0x105608;
    memory_allocate_dma_cold_3();
LAB_00105608:
    __addr = __s;
    pcStack_12e8 = (code *)0x105610;
    memory_allocate_dma_cold_2();
  }
  pcStack_12e8 = virt_to_phys;
  memory_allocate_dma_cold_1();
  uStack_1300 = uVar27;
  pcStack_12f8 = __addr;
  uStack_12f0 = uVar16;
  pcStack_12e8 = (code *)unaff_RBP;
  uVar27 = sysconf(0x1e);
  __buf_02 = (long *)0x0;
  uVar24 = open("/proc/self/pagemap",0);
  if (uVar24 == 0xffffffff) {
    virt_to_phys_cold_4();
LAB_001056c6:
    virt_to_phys_cold_3();
  }
  else {
    unaff_RBP = (void *)(ulong)uVar24;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar27;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = plVar13;
    uVar16 = SUB168(auVar5 % auVar4,0);
    __buf_02 = (long *)(((ulong)plVar13 / uVar27) * 8);
    _Var12 = lseek(uVar24,(__off_t)__buf_02,0);
    if (_Var12 == -1) goto LAB_001056c6;
    __buf_02 = alStack_1510;
    alStack_1510[0] = 0;
    sVar9 = read(uVar24,__buf_02,8);
    if (sVar9 != -1) {
      close(uVar24);
      if (alStack_1510[0] != 0) {
        return SUB164(auVar5 % auVar4,0) + (int)alStack_1510[0] * (int)uVar27;
      }
      goto LAB_001056da;
    }
  }
  virt_to_phys_cold_2();
LAB_001056da:
  plVar22 = plVar13;
  virt_to_phys_cold_1();
  uVar28 = 0x800;
  if ((int)__buf_02 != 0) {
    uVar28 = (ulong)__buf_02 & 0xffffffff;
  }
  if ((int)(0x200000 % uVar28) == 0) {
    iVar6 = (int)plVar22;
    plVar13 = (long *)malloc(((ulong)plVar22 & 0xffffffff) * 4 + 0x18);
    iVar26 = (int)uVar28;
    uVar24 = 0;
    dVar29 = memory_allocate_dma((ulong)(uint)(iVar26 * iVar6),false);
    *(int *)((long)plVar13 + 0xc) = iVar6;
    *(int *)(plVar13 + 1) = iVar26;
    *plVar13 = (long)dVar29.virt;
    *(int *)(plVar13 + 2) = iVar6;
    if (iVar6 != 0) {
      uVar27 = 0;
      do {
        *(int *)((long)plVar13 + uVar27 * 4 + 0x14) = (int)uVar27;
        lVar2 = *plVar13;
        uVar28 = (ulong)uVar24;
        uVar14 = virt_to_phys((void *)(uVar28 + lVar2));
        *(uintptr_t *)(lVar2 + uVar28) = uVar14;
        *(int *)(lVar2 + 0x10 + uVar28) = (int)uVar27;
        *(long **)(lVar2 + 8 + uVar28) = plVar13;
        *(undefined4 *)(lVar2 + 0x14 + uVar28) = 0;
        uVar27 = uVar27 + 1;
        uVar24 = uVar24 + iVar26;
      } while (((ulong)plVar22 & 0xffffffff) != uVar27);
    }
    return (uint32_t)plVar13;
  }
  uVar30 = extraout_RAX_00;
  plVar31 = plVar13;
  memory_allocate_mempool_cold_1();
  uVar11 = (ulong)extraout_EDX;
  if (*(uint *)(plVar22 + 2) < extraout_EDX) {
    fprintf(_stderr,"[WARN ] %s:%d %s(): memory pool %p only has %d free bufs, requested %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/memory.c"
            ,0x5f,"pkt_buf_alloc_batch",plVar22,(ulong)*(uint *)(plVar22 + 2),uVar11,extraout_RAX_01
            ,plVar13,uVar28,uVar30,plVar31,size,unaff_R13,uVar27,uVar16,unaff_RBP);
    uVar11 = (ulong)*(uint *)(plVar22 + 2);
  }
  if ((uint32_t)uVar11 != 0) {
    lVar2 = plVar22[1];
    uVar27 = (ulong)*(uint *)(plVar22 + 2);
    lVar23 = 0;
    do {
      uVar24 = (int)uVar27 - 1;
      uVar27 = (ulong)uVar24;
      *(ulong *)((long)__buf_02 + lVar23) =
           (ulong)(uint)(*(int *)((long)plVar22 + uVar27 * 4 + 0x14) * (int)lVar2) + *plVar22;
      lVar23 = lVar23 + 8;
    } while (uVar11 << 3 != lVar23);
    *(uint *)(plVar22 + 2) = uVar24;
  }
  return (uint32_t)uVar11;
}

Assistant:

uint32_t virtio_rx_batch(struct ixy_device* ixy, uint16_t queue_id, struct pkt_buf* bufs[], uint32_t num_bufs) {
	struct virtio_device* dev = IXY_TO_VIRTIO(ixy);
	struct virtqueue* vq = dev->rx_queue;
	uint32_t buf_idx;

	_mm_mfence();
	// Retrieve used bufs from the device
	for (buf_idx = 0; buf_idx < num_bufs; ++buf_idx) {
		// Section 3.2.2
		if (vq->vq_used_last_idx == vq->vring.used->idx) {
			break;
		}
		// info("Rx packet: last used %u, used idx %u", vq->vq_used_last_idx,
		// vq->vring.used->idx);
		struct vring_used_elem* e = vq->vring.used->ring + (vq->vq_used_last_idx % vq->vring.num);
		// info("Used elem %p, id %u len %u", e, e->id, e->len);
		struct vring_desc* desc = &vq->vring.desc[e->id];
		vq->vq_used_last_idx++;
		// We don't support chaining or indirect descriptors
		if (desc->flags != VRING_DESC_F_WRITE) {
			error("unsupported rx flags on descriptor: %x", desc->flags);
		}
		// info("Desc %lu %u %u %u", desc->addr, desc->len, desc->flags,
		// desc->next);
		*desc = (struct vring_desc){};

		// Section 5.1.6.4
		struct pkt_buf* buf = vq->virtual_addresses[e->id];
		buf->size = e->len;
		bufs[buf_idx] = buf;
		//struct virtio_net_hdr* hdr = (void*)(buf->head_room + sizeof(buf->head_room) - sizeof(net_hdr));

		// Update rx counter
		dev->rx_bytes += buf->size;
		dev->rx_pkts++;
	}
	// Fill empty slots in desciptor table
	for (uint16_t idx = 0; idx < vq->vring.num; ++idx) {
		struct vring_desc* desc = &vq->vring.desc[idx];
		if (desc->addr != 0) { // descriptor points to something, therefore it is in use
			continue;
		}
		// info("Found free desc slot at %u (%u)", idx, vq->vring.num);
		struct pkt_buf* buf = pkt_buf_alloc(vq->mempool);
		if (!buf) {
			error("failed to allocate new mbuf for rx, you are either leaking memory or your mempool is too small");
		}
		buf->size = vq->mempool->buf_size;
		memcpy(buf->head_room + sizeof(buf->head_room) - sizeof(net_hdr), &net_hdr, sizeof(net_hdr));
		vq->vring.desc[idx].len = buf->size + sizeof(net_hdr);
		vq->vring.desc[idx].addr =
		    buf->buf_addr_phy + offsetof(struct pkt_buf, head_room) + sizeof(buf->head_room) - sizeof(net_hdr);
		vq->vring.desc[idx].flags = VRING_DESC_F_WRITE;
		vq->vring.desc[idx].next = 0;
		vq->virtual_addresses[idx] = buf;
		vq->vring.avail->ring[vq->vring.avail->idx % vq->vring.num] = idx;
		_mm_mfence(); // Make sure exposed descriptors reach device before index is updated
		vq->vring.avail->idx++;
		_mm_mfence(); // Make sure the index update reaches device before it is triggered
		virtio_legacy_notify_queue(dev, 0);
	}
	return buf_idx;
}